

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O2

void __thiscall soplex::SPxSolverBase<double>::computeCoTest(SPxSolverBase<double> *this)

{
  Status stat;
  int iVar1;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  SPxOut *pSVar5;
  char *t;
  int iVar6;
  uint i;
  double dVar7;
  ulong extraout_XMM0_Qb;
  Verbosity old_verbosity;
  undefined4 local_50;
  Verbosity local_4c;
  double local_48;
  ulong uStack_40;
  
  local_48 = leavetol(this);
  this->m_pricingViolUpToDate = true;
  this->m_pricingViol = 0.0;
  this->m_numViol = 0;
  (this->infeasibilities).super_IdxSet.num = 0;
  i = (this->thecovectors->set).thenum;
  iVar6 = (int)((double)(int)i * this->sparsePricingFactor);
  local_48 = -local_48;
  uStack_40 = extraout_XMM0_Qb ^ 0x8000000000000000;
  while (0 < (int)i) {
    i = i - 1;
    stat = ((this->super_SPxBasisBase<double>).thedesc.costat)->data[i];
    if (this->theRep * stat < 1) {
      dVar7 = coTest(this,i,stat);
      (this->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[i] = dVar7;
      if (this->remainingRoundsEnter == 0) {
        if (local_48 <= dVar7) {
          (this->isInfeasible).data[i] = 0;
        }
        else {
          this->m_pricingViol = this->m_pricingViol - dVar7;
          DIdxSet::addIdx(&this->infeasibilities,i);
          (this->isInfeasible).data[i] = 1;
          this->m_numViol = this->m_numViol + 1;
        }
        if (iVar6 < (this->infeasibilities).super_IdxSet.num) {
          pSVar5 = this->spxout;
          if ((pSVar5 != (SPxOut *)0x0) && (3 < (int)pSVar5->m_verbosity)) {
            local_50 = 4;
            local_4c = pSVar5->m_verbosity;
            (*pSVar5->_vptr_SPxOut[2])(pSVar5,&local_50);
            pSVar5 = soplex::operator<<(this->spxout," --- using dense pricing");
            std::endl<char,std::char_traits<char>>(pSVar5->m_streams[pSVar5->m_verbosity]);
            (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_4c);
          }
          this->remainingRoundsEnter = 5;
          this->sparsePricingEnter = false;
          (this->infeasibilities).super_IdxSet.num = 0;
        }
      }
      else if (dVar7 < local_48) {
        this->m_pricingViol = this->m_pricingViol - dVar7;
        this->m_numViol = this->m_numViol + 1;
      }
    }
    else {
      (this->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[i] = 0.0;
      if (this->remainingRoundsEnter == 0) {
        (this->isInfeasible).data[i] = 0;
      }
    }
  }
  iVar1 = (this->infeasibilities).super_IdxSet.num;
  if ((iVar1 == 0) && (this->sparsePricingEnter == false)) {
    this->remainingRoundsEnter = this->remainingRoundsEnter + -1;
  }
  else if ((iVar1 <= iVar6) && (this->sparsePricingEnter == false)) {
    pSVar5 = this->spxout;
    if ((pSVar5 != (SPxOut *)0x0) && (local_4c = pSVar5->m_verbosity, 3 < (int)local_4c)) {
      local_50 = 4;
      (*pSVar5->_vptr_SPxOut[2])();
      pSVar5 = this->spxout;
      iVar6 = *(int *)(pSVar5->m_streams[pSVar5->m_verbosity] +
                      *(long *)(*(long *)pSVar5->m_streams[pSVar5->m_verbosity] + -0x18) + 8);
      t = " --- using sparse pricing, ";
      if (this->hyperPricingEnter != false) {
        t = " --- using hypersparse pricing, ";
      }
      soplex::operator<<(pSVar5,t);
      pSVar5 = soplex::operator<<(this->spxout,"sparsity: ");
      poVar2 = pSVar5->m_streams[pSVar5->m_verbosity];
      lVar3 = *(long *)poVar2;
      *(undefined8 *)(poVar2 + *(long *)(lVar3 + -0x18) + 0x10) = 6;
      *(uint *)(poVar2 + *(long *)(lVar3 + -0x18) + 0x18) =
           *(uint *)(poVar2 + *(long *)(lVar3 + -0x18) + 0x18) & 0xfffffefb | 4;
      *(undefined8 *)(poVar2 + *(long *)(lVar3 + -0x18) + 8) = 4;
      pSVar5 = soplex::operator<<(pSVar5,(double)(this->infeasibilities).super_IdxSet.num /
                                         (double)(this->thecovectors->set).thenum);
      poVar2 = pSVar5->m_streams[pSVar5->m_verbosity];
      lVar3 = *(long *)poVar2;
      lVar4 = *(long *)(lVar3 + -0x18);
      *(uint *)(poVar2 + lVar4 + 0x18) = *(uint *)(poVar2 + lVar4 + 0x18) & 0xfffffefb | 0x100;
      *(long *)(poVar2 + *(long *)(lVar3 + -0x18) + 8) = (long)iVar6;
      std::endl<char,std::char_traits<char>>(poVar2);
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_4c);
    }
    this->sparsePricingEnter = true;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeCoTest()
{
   int i;
   R pricingTol = leavetol();
   m_pricingViolUpToDate = true;
   m_pricingViol = 0;
   m_numViol = 0;
   infeasibilities.clear();
   int sparsitythreshold = (int)(sparsePricingFactor * dim());
   const typename SPxBasisBase<R>::Desc& ds = this->desc();

   for(i = dim() - 1; i >= 0; --i)
   {
      typename SPxBasisBase<R>::Desc::Status stat = ds.coStatus(i);

      if(isBasic(stat))
      {
         theCoTest[i] = 0;

         if(remainingRoundsEnter == 0)
            isInfeasible[i] = SPxPricer<R>::NOT_VIOLATED;
      }
      else
      {
         theCoTest[i] = coTest(i, stat);

         if(remainingRoundsEnter == 0)
         {
            if(theCoTest[i] < -pricingTol)
            {
               assert(infeasibilities.size() < infeasibilities.max());
               m_pricingViol -= theCoTest[i];
               infeasibilities.addIdx(i);
               isInfeasible[i] = SPxPricer<R>::VIOLATED;
               ++m_numViol;
            }
            else
               isInfeasible[i] = SPxPricer<R>::NOT_VIOLATED;

            if(infeasibilities.size() > sparsitythreshold)
            {
               SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- using dense pricing"
                             << std::endl;)
               remainingRoundsEnter = SOPLEX_DENSEROUNDS;
               sparsePricingEnter = false;
               infeasibilities.clear();
            }
         }
         else if(theCoTest[i] < -pricingTol)
         {
            m_pricingViol -= theCoTest[i];
            ++m_numViol;
         }
      }
   }

   if(infeasibilities.size() == 0 && !sparsePricingEnter)
      --remainingRoundsEnter;
   else if(infeasibilities.size() <= sparsitythreshold && !sparsePricingEnter)
   {
      SPX_MSG_INFO2((*this->spxout),
                    std::streamsize prec = spxout->precision();

                    if(hyperPricingEnter)
                    (*this->spxout) << " --- using hypersparse pricing, ";
                    else
                       (*this->spxout) << " --- using sparse pricing, ";
                       (*this->spxout) << "sparsity: "
                       << std::setw(6) << std::fixed << std::setprecision(4)
                       << (R) infeasibilities.size() / dim()
                       << std::scientific << std::setprecision(int(prec))
                       << std::endl;)
            sparsePricingEnter = true;
   }
}